

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int ncnn::reduction_op<std::plus<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,int dim,float coeff)

{
  int *piVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  void *pvVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  void *pvVar14;
  ulong uVar15;
  void *pvVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  size_t sVar21;
  uint uVar22;
  int iVar23;
  void *pvVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  
  uVar17 = a->w;
  uVar9 = (ulong)uVar17;
  uVar4 = a->h;
  sVar21 = (size_t)(int)uVar17;
  uVar12 = a->c;
  uVar7 = (ulong)uVar12;
  sVar8 = (size_t)(int)uVar12;
  uVar22 = uVar4 * uVar17;
  if (dim == 0) {
    if (((b->dims == 1) && (b->w == 1)) && (b->elemsize == 4)) goto switchD_001171e4_caseD_0;
    piVar1 = b->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) && (b->data != (void *)0x0)) {
        free(*(void **)((long)b->data + -8));
      }
    }
    b->elemsize = 4;
    b->dims = 1;
    b->w = 1;
    b->h = 1;
    b->c = 1;
    b->cstep = 1;
    pvVar6 = malloc(0x20);
    pvVar24 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)pvVar24 - 8) = pvVar6;
    b->data = pvVar24;
    b->refcount = (int *)((long)pvVar24 + 4);
    *(undefined4 *)((long)pvVar24 + 4) = 1;
    if (uVar12 == 0 || b->c == 0) {
      return -100;
    }
LAB_001176ea:
    pvVar6 = malloc(sVar8 * 4 + 0x1c);
    pvVar24 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)pvVar24 - 8) = pvVar6;
    *(undefined4 *)((long)pvVar24 + sVar8 * 4) = 1;
    if ((int)uVar12 < 1) {
      fVar25 = 0.0;
    }
    else {
      pvVar6 = a->data;
      sVar21 = a->cstep;
      sVar5 = a->elemsize;
      uVar9 = 0;
      do {
        fVar25 = 0.0;
        if (0 < (int)uVar22) {
          uVar13 = 0;
          do {
            fVar25 = fVar25 + *(float *)((long)pvVar6 + uVar13 * 4);
            uVar13 = uVar13 + 1;
          } while (uVar22 != uVar13);
        }
        *(float *)((long)pvVar24 + uVar9 * 4) = fVar25;
        uVar9 = uVar9 + 1;
        pvVar6 = (void *)((long)pvVar6 + sVar21 * sVar5);
      } while (uVar9 != uVar7);
      fVar25 = 0.0;
      if (0 < (int)uVar12) {
        uVar9 = 0;
        do {
          fVar25 = fVar25 + *(float *)((long)pvVar24 + uVar9 * 4);
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
    }
    *(float *)b->data = fVar25 * v0;
    LOCK();
    piVar1 = (int *)((long)pvVar24 + sVar8 * 4);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (pvVar24 == (void *)0x0 || *piVar1 != 0) {
      return 0;
    }
LAB_001177b4:
    free(*(void **)((long)pvVar24 - 8));
  }
  else {
    switch(dim) {
    case 1:
      if (((b->dims != 1) || (b->w != uVar12)) || (b->elemsize != 4)) {
        piVar1 = b->refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) && (b->data != (void *)0x0)) {
            free(*(void **)((long)b->data + -8));
          }
        }
        b->data = (void *)0x0;
        b->refcount = (int *)0x0;
        b->elemsize = 4;
        b->dims = 1;
        b->w = uVar12;
        b->h = 1;
        b->c = 1;
        b->cstep = sVar8;
        if (uVar12 != 0) {
          pvVar24 = malloc(sVar8 * 4 + 0x1c);
          pvVar6 = (void *)((long)pvVar24 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar6 + -8) = pvVar24;
          b->data = pvVar6;
          piVar1 = (int *)((long)pvVar6 + sVar8 * 4);
          b->refcount = piVar1;
          *piVar1 = 1;
          sVar5 = sVar8;
          goto LAB_001175ce;
        }
      }
      break;
    case 2:
      if (((b->dims != 2) || (b->w != uVar4)) || ((b->h != uVar12 || (b->elemsize != 4)))) {
        piVar1 = b->refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) && (b->data != (void *)0x0)) {
            free(*(void **)((long)b->data + -8));
          }
        }
        b->data = (void *)0x0;
        b->refcount = (int *)0x0;
        b->elemsize = 4;
        b->dims = 2;
        b->w = uVar4;
        b->h = uVar12;
        b->c = 1;
        uVar34 = uVar12 * uVar4;
        goto LAB_00117567;
      }
      break;
    case -2:
      if ((((b->dims == 2) && (b->w == uVar17)) && (b->h == uVar4)) && (b->elemsize == 4)) break;
      piVar1 = b->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) && (b->data != (void *)0x0)) {
          free(*(void **)((long)b->data + -8));
        }
      }
      b->data = (void *)0x0;
      b->refcount = (int *)0x0;
      b->elemsize = 4;
      b->dims = 2;
      b->w = uVar17;
      b->h = uVar4;
      b->c = 1;
      uVar34 = uVar22;
LAB_00117567:
      sVar5 = (size_t)(int)uVar34;
      b->cstep = sVar5;
      if (uVar34 == 0) break;
      pvVar24 = malloc(sVar5 * 4 + 0x1c);
      pvVar6 = (void *)((long)pvVar24 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar6 + -8) = pvVar24;
      b->data = pvVar6;
      piVar1 = (int *)((long)pvVar6 + sVar5 * 4);
      b->refcount = piVar1;
      *piVar1 = 1;
      goto LAB_001175ce;
    case -1:
      if (((b->dims != 1) || (b->w != uVar17)) || (b->elemsize != 4)) {
        piVar1 = b->refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) && (b->data != (void *)0x0)) {
            free(*(void **)((long)b->data + -8));
          }
        }
        b->data = (void *)0x0;
        b->refcount = (int *)0x0;
        b->elemsize = 4;
        b->dims = 1;
        b->w = uVar17;
        b->h = 1;
        b->c = 1;
        b->cstep = sVar21;
        if (uVar17 != 0) {
          pvVar24 = malloc(sVar21 * 4 + 0x1c);
          pvVar6 = (void *)((long)pvVar24 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar6 + -8) = pvVar24;
          b->data = pvVar6;
          piVar1 = (int *)((long)pvVar6 + sVar21 * 4);
          b->refcount = piVar1;
          *piVar1 = 1;
          sVar5 = sVar21;
          goto LAB_001175ce;
        }
      }
    }
switchD_001171e4_caseD_0:
    pvVar6 = b->data;
    if (pvVar6 == (void *)0x0) {
      return -100;
    }
    sVar5 = b->cstep;
LAB_001175ce:
    if (sVar5 * (long)b->c == 0) {
      return -100;
    }
    if (dim == 0) {
      if (uVar12 == 0) {
        return -100;
      }
      goto LAB_001176ea;
    }
    switch(dim) {
    case 1:
      if (0 < (int)uVar12) {
        sVar8 = a->cstep;
        sVar21 = a->elemsize;
        pvVar6 = a->data;
        pvVar24 = b->data;
        uVar9 = 0;
        do {
          fVar25 = 0.0;
          if (0 < (int)uVar22) {
            uVar13 = 0;
            do {
              fVar25 = fVar25 + *(float *)((long)pvVar6 + uVar13 * 4);
              uVar13 = uVar13 + 1;
            } while (uVar22 != uVar13);
          }
          *(float *)((long)pvVar24 + uVar9 * 4) = fVar25 * v0;
          uVar9 = uVar9 + 1;
          pvVar6 = (void *)((long)pvVar6 + sVar8 * sVar21);
        } while (uVar9 != uVar7);
      }
      break;
    case 2:
      if (0 < (int)uVar12) {
        pvVar6 = a->data;
        sVar8 = a->cstep;
        sVar2 = a->elemsize;
        pvVar24 = b->data;
        sVar3 = b->elemsize;
        uVar12 = uVar17 - 1;
        uVar9 = 0;
        do {
          if (0 < (int)uVar4) {
            pvVar16 = (void *)(sVar8 * sVar2 * uVar9 + (long)pvVar6);
            uVar13 = 0;
            do {
              if ((int)uVar17 < 1) {
                fVar25 = 0.0;
              }
              else {
                fVar25 = *(float *)((long)pvVar16 + uVar13 * 4);
                fVar27 = 0.0;
                fVar29 = 0.0;
                fVar31 = 0.0;
                fVar33 = 0.0;
                iVar19 = 4;
                do {
                  fVar32 = fVar33;
                  fVar30 = fVar31;
                  fVar28 = fVar29;
                  fVar26 = fVar27;
                  fVar27 = fVar25 + fVar26;
                  fVar29 = fVar25 + fVar28;
                  fVar31 = fVar25 + fVar30;
                  fVar33 = fVar25 + fVar32;
                  iVar20 = iVar19 + -4;
                  iVar23 = iVar19 + (uVar17 + 3 & 0xfffffffc);
                  iVar19 = iVar20;
                } while (iVar23 != 8);
                uVar22 = -iVar20;
                uVar34 = -(uint)((int)(uVar12 ^ 0x80000000) < (int)(uVar22 ^ 0x80000000));
                uVar35 = -(uint)((int)(uVar12 ^ 0x80000000) < (int)((uVar22 | 1) ^ 0x80000000));
                uVar36 = -(uint)((int)(uVar12 ^ 0x80000000) < (int)((uVar22 | 2) ^ 0x80000000));
                uVar22 = -(uint)((int)(uVar12 ^ 0x80000000) < (int)((uVar22 | 3) ^ 0x80000000));
                fVar25 = (float)(~uVar22 & (uint)fVar33 | (uint)fVar32 & uVar22) +
                         (float)(~uVar35 & (uint)fVar29 | (uint)fVar28 & uVar35) +
                         (float)(~uVar36 & (uint)fVar31 | (uint)fVar30 & uVar36) +
                         (float)(~uVar34 & (uint)fVar27 | (uint)fVar26 & uVar34);
              }
              *(float *)((long)pvVar24 + uVar13 * 4 + sVar5 * sVar3 * uVar9) = fVar25 * v0;
              pvVar16 = (void *)((long)pvVar16 + sVar21 * 4);
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar4);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar7);
      }
      break;
    case -2:
      uVar17 = (int)sVar5 * b->c;
      if (0 < (int)uVar17) {
        memset(pvVar6,0,(ulong)uVar17 << 2);
      }
      if (0 < (int)uVar12) {
        sVar8 = a->cstep;
        sVar21 = a->elemsize;
        pvVar6 = a->data;
        pvVar24 = b->data;
        uVar9 = 0;
        do {
          if (0 < (int)uVar22) {
            uVar13 = 0;
            do {
              *(float *)((long)pvVar24 + uVar13 * 4) =
                   *(float *)((long)pvVar6 + uVar13 * 4) + *(float *)((long)pvVar24 + uVar13 * 4);
              uVar13 = uVar13 + 1;
            } while (uVar22 != uVar13);
          }
          uVar9 = uVar9 + 1;
          pvVar6 = (void *)((long)pvVar6 + sVar8 * sVar21);
        } while (uVar9 != uVar7);
      }
      if (0 < (int)uVar22) {
        pvVar6 = b->data;
        uVar7 = 0;
        do {
          *(float *)((long)pvVar6 + uVar7 * 4) = *(float *)((long)pvVar6 + uVar7 * 4) * v0;
          uVar7 = uVar7 + 1;
        } while (uVar22 != uVar7);
      }
      break;
    case -1:
      uVar13 = sVar21 + 3 & 0x3ffffffffffffffc;
      lVar10 = sVar8 * uVar13;
      if (lVar10 == 0) {
        return -100;
      }
      pvVar6 = malloc(lVar10 * 4 + 0x1c);
      pvVar24 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar24 + -8) = pvVar6;
      *(undefined4 *)((long)pvVar24 + lVar10 * 4) = 1;
      uVar22 = uVar12 * (int)uVar13;
      if (0 < (int)uVar22) {
        memset(pvVar24,0,(ulong)uVar22 << 2);
      }
      if (0 < (int)uVar12) {
        sVar8 = a->cstep;
        sVar2 = a->elemsize;
        pvVar6 = a->data;
        uVar11 = 0;
        pvVar16 = pvVar24;
        do {
          if (0 < (int)uVar4) {
            pvVar14 = (void *)(sVar8 * sVar2 * uVar11 + (long)pvVar6);
            uVar15 = 0;
            do {
              if (0 < (int)uVar17) {
                uVar18 = 0;
                do {
                  *(float *)((long)pvVar16 + uVar18 * 4) =
                       *(float *)((long)pvVar14 + uVar15 * 4) +
                       *(float *)((long)pvVar16 + uVar18 * 4);
                  uVar18 = uVar18 + 1;
                } while (uVar9 != uVar18);
              }
              pvVar14 = (void *)((long)pvVar14 + sVar21 * 4);
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar4);
          }
          uVar11 = uVar11 + 1;
          pvVar16 = (void *)((long)pvVar16 + uVar13 * 4);
        } while (uVar11 != uVar7);
      }
      uVar4 = (int)sVar5 * b->c;
      if (0 < (int)uVar4) {
        memset(b->data,0,(ulong)uVar4 << 2);
      }
      if (0 < (int)uVar12) {
        pvVar6 = b->data;
        uVar11 = 0;
        pvVar16 = pvVar24;
        do {
          if (0 < (int)uVar17) {
            uVar15 = 0;
            do {
              *(float *)((long)pvVar6 + uVar15 * 4) =
                   *(float *)((long)pvVar16 + uVar15 * 4) + *(float *)((long)pvVar6 + uVar15 * 4);
              uVar15 = uVar15 + 1;
            } while (uVar9 != uVar15);
          }
          uVar11 = uVar11 + 1;
          pvVar16 = (void *)((long)pvVar16 + uVar13 * 4);
        } while (uVar11 != uVar7);
      }
      if (0 < (int)uVar17) {
        pvVar6 = b->data;
        uVar7 = 0;
        do {
          *(float *)((long)pvVar6 + uVar7 * 4) = *(float *)((long)pvVar6 + uVar7 * 4) * v0;
          uVar7 = uVar7 + 1;
        } while (uVar9 != uVar7);
      }
      LOCK();
      piVar1 = (int *)((long)pvVar24 + lVar10 * 4);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (pvVar24 == (void *)0x0 || *piVar1 != 0) {
        return 0;
      }
      goto LAB_001177b4;
    }
  }
  return 0;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, int dim, float coeff)
{
    Op op;
    Op2 op2;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;

    if (dim == 0)
    {
        // w h c -> X X X
        b.create(1);
    }
    else if (dim == 1)
    {
        // w h c -> X X c
        b.create(channels);
    }
    else if (dim == 2)
    {
        // w h c -> X h c
        b.create(h, channels);
    }
    else if (dim == -1)
    {
        // w h c -> w X X
        b.create(w);
    }
    else if (dim == -2)
    {
        // w h c -> w h X
        b.create(w, h);
    }
    if (b.empty())
        return -100;

    if (dim == 0)
    {
        Mat sums(channels);
        if (sums.empty())
            return -100;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            sums[q] = sum;
        }

        float sum = v0;
        for (int i=0; i<channels; i++)
        {
            sum = op2(sum, sums[i]);
        }

        b[0] = sum * coeff;
    }
    else if (dim == 1)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            b[q] = sum * coeff;
        }
    }
    else if (dim == 2)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = b.channel(q);

            for (int i=0; i<h; i++)
            {
                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[i] = sum * coeff;

                ptr += w;
            }
        }
    }
    else if (dim == -1)
    {
        Mat mins(w, 1, channels);
        if (mins.empty())
            return -100;

        mins.fill(v0);

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* mins_ptr = mins.channel(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    mins_ptr[j] = op(mins_ptr[j], ptr[i]);
                }

                ptr += w;
            }
        }

        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* mins_ptr = mins.channel(q);
            for (int j=0; j<w; j++)
            {
                b[j] = op2(b[j], mins_ptr[j]);
            }
        }

        for (int j=0; j<w; j++)
        {
            b[j] *= coeff;
        }
    }
    else if (dim == -2)
    {
        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            for (int i=0; i<size; i++)
            {
                b[i] = op(b[i], ptr[i]);
            }
        }

        for (int i=0; i<size; i++)
        {
            b[i] *= coeff;
        }
    }

    return 0;
}